

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::DeclareStmt::~DeclareStmt(DeclareStmt *this)

{
  bool bVar1;
  reference ppIVar2;
  Identifier *ident;
  iterator __end2;
  iterator __begin2;
  vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_> *__range2;
  DeclareStmt *this_local;
  
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__DeclareStmt_0014f568;
  __end2 = std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::begin(&this->varList)
  ;
  ident = (Identifier *)
          std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::end(&this->varList);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<ast::Identifier_**,_std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>_>
                      (&__end2,(__normal_iterator<ast::Identifier_**,_std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>_>
                                *)&ident);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<ast::Identifier_**,_std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>_>
              ::operator*(&__end2);
    if (*ppIVar2 != (Identifier *)0x0) {
      (*((*ppIVar2)->super_Expr).super_Node._vptr_Node[1])();
    }
    __gnu_cxx::
    __normal_iterator<ast::Identifier_**,_std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::clear(&this->varList);
  std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::~vector(&this->varList);
  token::Token::~Token(&this->tok);
  Stmt::~Stmt(&this->super_Stmt);
  return;
}

Assistant:

~DeclareStmt(){
        for(auto ident : varList){
            delete ident;
        }
        varList.clear();
    }